

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::TryDecimalStringCast<short,(char)46>
               (char *string_ptr,idx_t string_size,short *result,uint8_t width,uint8_t scale)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  idx_t iVar9;
  ExponentData exponent;
  DecimalCastData<short> local_5c;
  ulong local_50;
  char *local_48;
  ulong local_40;
  short *local_38;
  
  local_5c.result = 0;
  local_5c.digit_count = '\0';
  local_5c.decimal_count = '\0';
  local_5c.round_set = false;
  local_5c.should_round = false;
  local_5c.excessive_decimals = '\0';
  local_5c.exponent_type = NONE;
  local_5c.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  uVar8 = 0;
  while( true ) {
    uVar5 = string_size - uVar8;
    if (uVar5 == 0) {
      return false;
    }
    bVar2 = string_ptr[uVar8];
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) break;
    uVar8 = uVar8 + 1;
  }
  local_5c.width = width;
  local_5c.scale = scale;
  local_38 = result;
  if (bVar2 == 0x2d) {
    uVar6 = string_size - uVar8;
    uVar5 = 1;
    while (uVar3 = uVar5, uVar3 < uVar6) {
      bVar2 = string_ptr[uVar8 + uVar3];
      if (9 < (byte)(bVar2 - 0x30)) {
        if (bVar2 != 0x2e) goto LAB_0098d4ac;
        local_50 = uVar3 + 1;
        uVar5 = local_50;
        goto LAB_0098d328;
      }
      bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<short>,true>
                        (&local_5c,bVar2 - 0x30);
      if ((!bVar1) ||
         (((uVar5 = uVar6, ~uVar3 + string_size != uVar8 &&
           (uVar5 = uVar3 + 1, string_ptr[uVar8 + 1 + uVar3] == '_')) &&
          (((string_size - uVar3) - 2 == uVar8 ||
           (uVar5 = uVar3 + 2, 9 < (byte)(string_ptr[uVar8 + 2 + uVar3] - 0x30U))))))) {
        return false;
      }
    }
LAB_0098d2f2:
    bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_5c);
    if (!bVar1) {
      return false;
    }
    if (uVar3 < 2) {
      return false;
    }
    goto LAB_0098d3f4;
  }
  if (bVar2 == 0x30 && string_size - 1 != uVar8) {
    bVar1 = (bool)string_ptr[uVar8 + 1];
    if (bVar1 == true) {
LAB_0098d3b0:
      if ((string_size - uVar8) - 3 < 0xfffffffffffffffe) {
        return false;
      }
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_5c);
      return false;
    }
    if (bVar1 != true) {
      if (bVar1 == true) goto LAB_0098d3b0;
      if (bVar1 != true) goto LAB_0098d263;
    }
    bVar1 = IntegerHexCastLoop<duckdb::DecimalCastData<short>,false,false,duckdb::DecimalCastOperation>
                      (string_ptr + uVar8 + 1,~uVar8 + string_size,&local_5c,bVar1);
LAB_0098d256:
    if (bVar1 == false) {
      return false;
    }
  }
  else {
LAB_0098d263:
    local_50 = (ulong)(bVar2 == 0x2b);
    uVar6 = local_50;
    while (uVar3 = uVar6, uVar6 = uVar3, uVar3 < uVar5) {
      bVar2 = string_ptr[uVar8 + uVar3];
      if (9 < (byte)(bVar2 - 0x30)) {
        if (bVar2 != 0x2e) goto LAB_0098d503;
        local_40 = uVar3 + 1;
        uVar4 = local_40;
        goto LAB_0098d416;
      }
      bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<short>,false>
                        (&local_5c,bVar2 - 0x30);
      if (!bVar1) {
        return false;
      }
      uVar6 = uVar5;
      if ((~uVar3 + string_size != uVar8) &&
         (uVar6 = uVar3 + 1, string_ptr[uVar8 + 1 + uVar3] == '_')) {
        if ((string_size - uVar3) - 2 == uVar8) {
          return false;
        }
        uVar6 = uVar3 + 2;
        if (9 < (byte)(string_ptr[uVar8 + 2 + uVar3] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0098d3db:
    bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_5c);
    if (!bVar1) {
      return false;
    }
    if (uVar6 <= local_50) {
      return false;
    }
  }
LAB_0098d3f4:
  *local_38 = local_5c.result;
  return true;
LAB_0098d328:
  uVar4 = uVar5;
  if (uVar4 < uVar6) {
    local_48 = string_ptr + uVar4;
    bVar2 = local_48[uVar8];
    if ((byte)(bVar2 - 0x30) < 10) goto code_r0x0098d34d;
    bVar1 = uVar3 < 2;
    uVar3 = uVar4;
    if (uVar4 <= local_50 && bVar1) {
      return false;
    }
LAB_0098d4ac:
    if (bVar2 - 9 < 5) {
LAB_0098d4bb:
      uVar5 = uVar3 + 1;
      uVar3 = uVar5;
      if (uVar5 < uVar6) {
        uVar3 = uVar6;
      }
      for (; uVar5 < uVar6; uVar5 = uVar5 + 1) {
        if (0x20 < (ulong)(byte)string_ptr[uVar8 + uVar5]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar8 + uVar5] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0098d2f2;
    }
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x20) {
        return false;
      }
      goto LAB_0098d4bb;
    }
    if (uVar3 == 1) {
      return false;
    }
    if (uVar6 <= uVar3 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar7 = string_ptr + uVar8 + uVar3 + 1;
    iVar9 = ~uVar8 + (string_size - uVar3);
    if (*pcVar7 == '-') {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar7,iVar9,&exponent,false);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar7,iVar9,&exponent,false);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                      (&local_5c,(int)exponent.result);
    goto LAB_0098d256;
  }
  bVar1 = uVar3 < 2;
  uVar3 = uVar4;
  if (uVar4 <= local_50 && bVar1) {
    return false;
  }
  goto LAB_0098d2f2;
code_r0x0098d34d:
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<short>,true,true>
                    (&local_5c,bVar2 - 0x30);
  if (!bVar1) {
    return false;
  }
  uVar5 = uVar6;
  if ((~uVar4 + string_size != uVar8) && (uVar5 = uVar4 + 1, local_48[uVar8 + 1] == '_')) {
    if ((string_size - uVar4) - 2 == uVar8) {
      return false;
    }
    uVar5 = uVar4 + 2;
    if (9 < (byte)(local_48[uVar8 + 2] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0098d328;
LAB_0098d416:
  uVar6 = uVar4;
  if (uVar6 < uVar5) {
    local_48 = string_ptr + uVar6;
    bVar2 = local_48[uVar8];
    if ((byte)(bVar2 - 0x30) < 10) goto code_r0x0098d43b;
    bVar1 = uVar3 <= local_50;
    uVar3 = uVar6;
    if (uVar6 <= local_40 && bVar1) {
      return false;
    }
LAB_0098d503:
    if (bVar2 - 9 < 5) {
LAB_0098d50e:
      uVar3 = uVar3 + 1;
      uVar6 = uVar3;
      if (uVar3 < uVar5) {
        uVar6 = uVar5;
      }
      for (; uVar3 < uVar5; uVar3 = uVar3 + 1) {
        if (0x20 < (ulong)(byte)string_ptr[uVar8 + uVar3]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar8 + uVar3] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0098d3db;
    }
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x20) {
        return false;
      }
      goto LAB_0098d50e;
    }
    if (uVar3 == local_50) {
      return false;
    }
    if (uVar5 <= uVar3 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar7 = string_ptr + uVar8 + uVar3 + 1;
    iVar9 = ~uVar8 + (string_size - uVar3);
    if (*pcVar7 == '-') {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar7,iVar9,&exponent,false);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar7,iVar9,&exponent,false);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                      (&local_5c,(int)exponent.result);
    goto LAB_0098d256;
  }
  if (uVar6 <= local_40 && uVar3 <= local_50) {
    return false;
  }
  goto LAB_0098d3db;
code_r0x0098d43b:
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<short>,false,true>
                    (&local_5c,bVar2 - 0x30);
  if (!bVar1) {
    return false;
  }
  uVar4 = uVar5;
  if ((~uVar6 + string_size != uVar8) && (uVar4 = uVar6 + 1, local_48[uVar8 + 1] == '_')) {
    if ((string_size - uVar6) - 2 == uVar8) {
      return false;
    }
    uVar4 = uVar6 + 2;
    if (9 < (byte)(local_48[uVar8 + 2] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0098d416;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}